

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fakeit.hpp
# Opt level: O3

unsigned_long __thiscall
fakeit::RepeatForever<unsigned_long>::invoke
          (RepeatForever<unsigned_long> *this,ArgumentsTuple<> *args)

{
  unsigned_long uVar1;
  _Any_data local_30;
  _Manager_type local_20;
  
  std::function<unsigned_long_()>::function((function<unsigned_long_()> *)&local_30,&this->f);
  uVar1 = TupleDispatcher::invoke<unsigned_long>((function<unsigned_long_()> *)&local_30,args);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return uVar1;
}

Assistant:

virtual R invoke(const ArgumentsTuple<arglist...> & args) override {
            return TupleDispatcher::invoke<R, arglist...>(f, args);
        }